

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O1

void class_addmethod(_class *c,t_method fn,t_symbol *sel,t_atomtype arg1,...)

{
  long lVar1;
  char in_AL;
  t_symbol *ptVar2;
  t_methodentry *ptVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  _pdinstance *pdinstance;
  long lVar7;
  void **ppvVar8;
  ulong uVar9;
  void **ppvVar10;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar11;
  bool bVar12;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  uchar argvec [6];
  uint local_168;
  undefined4 local_146;
  undefined2 local_142;
  long local_140;
  char local_138 [79];
  undefined1 local_e9;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (c == (_class *)0x0) {
    return;
  }
  ppvVar8 = &ap[0].overflow_arg_area;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (sel == &s_signal) {
    if (c->c_floatsignalin != 0) {
      post("warning: signal method overrides class_mainsignalin");
    }
    c->c_floatsignalin = -1;
  }
  if (sel == &s_bang) {
    if (arg1 == A_NULL) {
      c->c_bangmethod = (t_bangmethod)fn;
      return;
    }
  }
  else if (sel == &s_float) {
    if ((arg1 == A_FLOAT) && ((int)local_c8 == 0)) {
      c->c_floatmethod = (t_floatmethod)fn;
      return;
    }
  }
  else if (sel == &s_symbol) {
    if ((arg1 == A_SYMBOL) && ((int)local_c8 == 0)) {
      c->c_symbolmethod = (t_symbolmethod)fn;
      return;
    }
  }
  else if (sel == &s_list) {
    if (arg1 == A_GIMME) {
      c->c_listmethod = (t_listmethod)fn;
      return;
    }
  }
  else {
    if (sel != &s_anything) {
      bVar12 = arg1 != A_NULL;
      if (arg1 == A_NULL) {
        uVar9 = 0;
      }
      else {
        local_168 = 0x20;
        uVar5 = 0;
        do {
          *(char *)((long)&local_146 + uVar5) = (char)arg1;
          if (local_168 < 0x29) {
            uVar9 = (ulong)local_168;
            local_168 = local_168 + 8;
            ppvVar10 = (void **)((long)local_e8 + uVar9);
          }
          else {
            ppvVar10 = ppvVar8;
            ppvVar8 = ppvVar8 + 1;
          }
          arg1 = *(t_atomtype *)ppvVar10;
          uVar9 = uVar5 + 1;
          bVar12 = arg1 != A_NULL;
        } while ((bVar12) && (bVar11 = uVar5 < 4, uVar5 = uVar9, bVar11));
      }
      if (bVar12) {
        if (c->c_name == (t_symbol *)0x0) {
          pcVar6 = "<anon>";
        }
        else {
          pcVar6 = c->c_name->s_name;
        }
        if (sel == (t_symbol *)0x0) {
          pcVar4 = "<nomethod>";
        }
        else {
          pcVar4 = sel->s_name;
        }
        pd_error((void *)0x0,"%s_%s: only 5 arguments are typecheckable; use A_GIMME",pcVar6,pcVar4)
        ;
      }
      *(undefined1 *)((long)&local_146 + uVar9) = 0;
      local_140 = (long)c->c_nmethod;
      if (0 < local_140) {
        lVar1 = local_140 * 0x18;
        lVar7 = 0;
        do {
          if ((sel != (t_symbol *)0x0) &&
             (*(t_symbol **)(c->c_methods->me_arg + lVar7 + -0x10) == sel)) {
            snprintf(local_138,0x50,"%s_aliased",sel->s_name);
            local_e9 = 0;
            ptVar2 = dogensym(local_138,(t_symbol *)0x0,pdinstance);
            *(t_symbol **)(c->c_methods->me_arg + lVar7 + -0x10) = ptVar2;
            if (pd_objectmaker == c) {
              logpost((void *)0x0,4,"warning: class \'%s\' overwritten; old one renamed \'%s\'",
                      sel->s_name,local_138);
            }
            else {
              logpost((void *)0x0,4,"warning: old method \'%s\' for class \'%s\' renamed \'%s\'",
                      sel->s_name,c->c_name->s_name,local_138);
            }
          }
          lVar7 = lVar7 + 0x18;
        } while (lVar1 != lVar7);
      }
      lVar1 = local_140;
      ptVar3 = (t_methodentry *)resizebytes(c->c_methods,local_140 * 0x18,local_140 * 0x18 + 0x18);
      c->c_methods = ptVar3;
      ptVar3[lVar1].me_name = sel;
      ptVar3[lVar1].me_fun = (t_gotfn)fn;
      *(undefined4 *)ptVar3[lVar1].me_arg = local_146;
      *(undefined2 *)(ptVar3[lVar1].me_arg + 4) = local_142;
      c->c_nmethod = c->c_nmethod + 1;
      return;
    }
    if (arg1 == A_GIMME) {
      c->c_anymethod = (t_anymethod)fn;
      return;
    }
  }
  if (c->c_name == (t_symbol *)0x0) {
    pcVar6 = "<anon>";
  }
  else {
    pcVar6 = c->c_name->s_name;
  }
  if (sel == (t_symbol *)0x0) {
    pcVar4 = "<nomethod>";
  }
  else {
    pcVar4 = sel->s_name;
  }
  bug("class_addmethod: %s_%s: bad argument types\n",pcVar6,pcVar4);
  return;
}

Assistant:

void class_addmethod(t_class *c, t_method fn, t_symbol *sel,
    t_atomtype arg1, ...)
{
    va_list ap;
    t_atomtype argtype = arg1;
    int nargs, i;
    if(!c)
        return;
    va_start(ap, arg1);
        /* "signal" method specifies that we take audio signals but
        that we don't want automatic float to signal conversion.  This
        is obsolete; you should now use the CLASS_MAINSIGNALIN macro. */
    if (sel == &s_signal)
    {
        if (c->c_floatsignalin)
            post("warning: signal method overrides class_mainsignalin");
        c->c_floatsignalin = -1;
    }
        /* check for special cases.  "Pointer" is missing here so that
        pd_objectmaker's pointer method can be typechecked differently.  */
    if (sel == &s_bang)
    {
        if (argtype) goto phooey;
        class_addbang(c, fn);
    }
    else if (sel == &s_float)
    {
        if (argtype != A_FLOAT || va_arg(ap, t_atomtype)) goto phooey;
        class_doaddfloat(c, fn);
    }
    else if (sel == &s_symbol)
    {
        if (argtype != A_SYMBOL || va_arg(ap, t_atomtype)) goto phooey;
        class_addsymbol(c, fn);
    }
    else if (sel == &s_list)
    {
        if (argtype != A_GIMME) goto phooey;
        class_addlist(c, fn);
    }
    else if (sel == &s_anything)
    {
        if (argtype != A_GIMME) goto phooey;
        class_addanything(c, fn);
    }
    else
    {
        unsigned char argvec[MAXPDARG+1];
        nargs = 0;
        while (argtype != A_NULL && nargs < MAXPDARG)
        {
            argvec[nargs++] = argtype;
            argtype = va_arg(ap, t_atomtype);
        }
        if (argtype != A_NULL)
            pd_error(0, "%s_%s: only 5 arguments are typecheckable; use A_GIMME",
                (c->c_name)?(c->c_name->s_name):"<anon>", sel?(sel->s_name):"<nomethod>");
        argvec[nargs] = 0;
#ifdef PDINSTANCE
        for (i = 0; i < pd_ninstances; i++)
        {
            class_addmethodtolist(c, &c->c_methods[i], c->c_nmethod,
                (t_gotfn)fn, sel?dogensym(sel->s_name, 0, pd_instances[i]):0,
                    argvec, pd_instances[i]);
        }
#else
        class_addmethodtolist(c, &c->c_methods, c->c_nmethod,
            (t_gotfn)fn, sel, argvec, &pd_maininstance);
#endif
        c->c_nmethod++;
    }
    goto done;
phooey:
    bug("class_addmethod: %s_%s: bad argument types\n",
        (c->c_name)?(c->c_name->s_name):"<anon>", sel?(sel->s_name):"<nomethod>");
done:
    va_end(ap);
    return;
}